

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall lest::message::~message(message *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__message_001e0ba8;
  pcVar1 = (this->note).info._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->note).info.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->where).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->where).file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->kind)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->kind).field_2) {
    operator_delete(pcVar1);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~message() throw() {}